

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void sync_enc_workers(MultiThreadInfo *mt_info,AV1_COMMON *cm,int num_workers)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  MACROBLOCKD *xd;
  AVxWorker *worker;
  int i;
  aom_internal_error_info error_info;
  int had_error;
  AVxWorker *worker_main;
  AVxWorkerInterface *winterface;
  aom_internal_error_info *in_stack_fffffffffffffe18;
  aom_internal_error_info *in_stack_fffffffffffffe20;
  int local_1d4;
  undefined1 local_1d0 [420];
  int local_2c;
  long local_28;
  AVxWorkerInterface *local_20;
  int local_14;
  long local_10;
  long local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = aom_get_worker_interface();
  local_28 = *(long *)(local_8 + 0x38);
  local_2c = *(int *)(local_28 + 0x30);
  if (local_2c != 0) {
    memcpy(local_1d0,(void *)(*(long *)(local_28 + 0x20) + 0x18),0x1a0);
  }
  while (local_1d4 = local_14 + -1, 0 < local_1d4) {
    in_stack_fffffffffffffe20 =
         (aom_internal_error_info *)(*(long *)(local_8 + 0x38) + (long)local_1d4 * 0x38);
    iVar1 = (*local_20->sync)((AVxWorker *)in_stack_fffffffffffffe20);
    local_14 = local_1d4;
    if (iVar1 == 0) {
      local_2c = 1;
      memcpy(local_1d0,
             (void *)((long)*(void **)((long)in_stack_fffffffffffffe20->detail + 0x18) + 0x18),0x1a0
            );
    }
  }
  if (local_2c != 0) {
    aom_internal_error_copy(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  *(undefined8 *)(*(long *)(*(long *)(local_28 + 0x20) + 8) + 0x2b90) =
       *(undefined8 *)(local_10 + 0x30);
  return;
}

Assistant:

static inline void sync_enc_workers(MultiThreadInfo *const mt_info,
                                    AV1_COMMON *const cm, int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  const AVxWorker *const worker_main = &mt_info->workers[0];
  int had_error = worker_main->had_error;
  struct aom_internal_error_info error_info;

  // Read the error_info of main thread.
  if (had_error) {
    error_info = ((EncWorkerData *)worker_main->data1)->error_info;
  }

  // Encoding ends.
  for (int i = num_workers - 1; i > 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    if (!winterface->sync(worker)) {
      had_error = 1;
      error_info = ((EncWorkerData *)worker->data1)->error_info;
    }
  }

  if (had_error) aom_internal_error_copy(cm->error, &error_info);

  // Restore xd->error_info of the main thread back to cm->error so that the
  // multithreaded code, when executed using a single thread, has a valid
  // xd->error_info.
  MACROBLOCKD *const xd = &((EncWorkerData *)worker_main->data1)->td->mb.e_mbd;
  xd->error_info = cm->error;
}